

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

uint32_t xor_flushone_decrement_buffer
                   (xor_setbuffer_t *buffer,xor_xorset_t *sets,xor_keyindex_t *Q,size_t *Qsize)

{
  ulong uVar1;
  uint uVar2;
  xor_keyindex_t ki;
  size_t i;
  uint32_t base;
  size_t qsize;
  uint32_t slot;
  uint32_t slot_1;
  uint32_t bestcount;
  uint32_t bestslot;
  size_t *Qsize_local;
  xor_keyindex_t *Q_local;
  xor_xorset_t *sets_local;
  xor_setbuffer_t *buffer_local;
  
  bestslot = 0;
  bestcount = *buffer->counts;
  for (slot_1 = 1; slot_1 < buffer->slotcount; slot_1 = slot_1 + 1) {
    if (bestcount < buffer->counts[slot_1]) {
      bestslot = slot_1;
      bestcount = buffer->counts[slot_1];
    }
  }
  qsize = *Qsize;
  uVar2 = bestslot << ((byte)buffer->insignificantbits & 0x1f);
  for (i = (size_t)uVar2; i < buffer->counts[bestslot] + uVar2; i = i + 1) {
    uVar1 = *(ulong *)&buffer->buffer[i].index;
    sets[uVar1 & 0xffffffff].xormask = buffer->buffer[i].hash ^ sets[uVar1 & 0xffffffff].xormask;
    sets[uVar1 & 0xffffffff].count = sets[uVar1 & 0xffffffff].count - 1;
    if (sets[uVar1 & 0xffffffff].count == 1) {
      Q[qsize].hash = sets[uVar1 & 0xffffffff].xormask;
      *(ulong *)&Q[qsize].index = uVar1;
      qsize = qsize + 1;
    }
  }
  *Qsize = qsize;
  buffer->counts[bestslot] = 0;
  return bestslot;
}

Assistant:

static inline uint32_t xor_flushone_decrement_buffer(xor_setbuffer_t *buffer,
                                                     xor_xorset_t *sets,
                                                     xor_keyindex_t *Q,
                                                     size_t *Qsize) {
  uint32_t bestslot = 0;
  uint32_t bestcount = buffer->counts[bestslot];
  for (uint32_t slot = 1; slot < buffer->slotcount; slot++) {
    if (buffer->counts[slot] > bestcount) {
      bestslot = slot;
      bestcount = buffer->counts[slot];
    }
  }
  uint32_t slot = bestslot;
  size_t qsize = *Qsize;
  // for(uint32_t slot = 0; slot < buffer->slotcount; slot++) {
  uint32_t base = (slot << (uint32_t)buffer->insignificantbits);
  for (size_t i = base; i < buffer->counts[slot] + base; i++) {
    xor_keyindex_t ki = buffer->buffer[i];
    sets[ki.index].xormask ^= ki.hash;
    sets[ki.index].count--;
    if (sets[ki.index].count == 1) {
      ki.hash = sets[ki.index].xormask;
      Q[qsize] = ki;
      qsize += 1;
    }
  }
  *Qsize = qsize;
  buffer->counts[slot] = 0;
  //}
  return bestslot;
}